

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.c
# Opt level: O0

lws_mqtt_str_t * lws_mqtt_str_create(uint16_t lim)

{
  lws_mqtt_str_t *s;
  lws_mqtt_str_t *plStack_10;
  uint16_t lim_local;
  
  plStack_10 = (lws_mqtt_str_t *)lws_realloc((void *)0x0,(ulong)lim + 0x11,"lws_mqtt_str_create");
  if (plStack_10 == (lws_mqtt_str_t *)0x0) {
    plStack_10 = (lws_mqtt_str_t *)0x0;
  }
  else {
    plStack_10->len = 0;
    plStack_10->pos = 0;
    plStack_10->buf = (uint8_t *)(plStack_10 + 1);
    plStack_10->limit = lim;
    plStack_10->len_valid = '\0';
    plStack_10->needs_freeing = '\x01';
  }
  return plStack_10;
}

Assistant:

lws_mqtt_str_t *
lws_mqtt_str_create(uint16_t lim)
{
	lws_mqtt_str_t *s = lws_malloc(sizeof(*s) + lim + 1, __func__);

	if (!s)
		return NULL;

	s->len = 0;
	s->pos = 0;
	s->buf = (uint8_t *)&s[1];
	s->limit = lim;
	s->len_valid = 0;
	s->needs_freeing = 1;

	return s;
}